

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

Offset __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteFixupU32Leb128Size
          (BinaryWriter *this,Offset offset,Offset leb_size_guess,char *desc)

{
  size_t sVar1;
  Offset OVar2;
  uint32_t value;
  Offset size_1;
  Offset dst_offset;
  Offset src_offset;
  Offset delta;
  Offset leb_size;
  Offset size;
  char *desc_local;
  Offset leb_size_guess_local;
  Offset offset_local;
  BinaryWriter *this_local;
  
  if ((this->options_->canonicalize_lebs & 1U) == 0) {
    sVar1 = Stream::offset(this->stream_);
    WriteFixedU32Leb128At(this->stream_,offset,((int)sVar1 - (int)offset) - 5,desc);
    this_local = (BinaryWriter *)0x0;
  }
  else {
    sVar1 = Stream::offset(this->stream_);
    sVar1 = (sVar1 - offset) - leb_size_guess;
    value = (uint32_t)sVar1;
    OVar2 = U32Leb128Length(value);
    this_local = (BinaryWriter *)(OVar2 - leb_size_guess);
    if (this_local != (BinaryWriter *)0x0) {
      Stream::MoveData(this->stream_,offset + OVar2,offset + leb_size_guess,sVar1);
    }
    WriteU32Leb128At(this->stream_,offset,value,desc);
    Stream::AddOffset(this->stream_,(ssize_t)this_local);
  }
  return (Offset)this_local;
}

Assistant:

Offset BinaryWriter::WriteFixupU32Leb128Size(Offset offset,
                                             Offset leb_size_guess,
                                             const char* desc) {
  if (options_.canonicalize_lebs) {
    Offset size = stream_->offset() - offset - leb_size_guess;
    Offset leb_size = U32Leb128Length(size);
    Offset delta = leb_size - leb_size_guess;
    if (delta != 0) {
      Offset src_offset = offset + leb_size_guess;
      Offset dst_offset = offset + leb_size;
      stream_->MoveData(dst_offset, src_offset, size);
    }
    WriteU32Leb128At(stream_, offset, size, desc);
    stream_->AddOffset(delta);
    return delta;
  } else {
    Offset size = stream_->offset() - offset - MAX_U32_LEB128_BYTES;
    WriteFixedU32Leb128At(stream_, offset, size, desc);
    return 0;
  }
}